

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O2

void __thiscall merlin::detail::edge::messageBwd(edge *this)

{
  node *pnVar1;
  pointer ppeVar2;
  edge *peVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  variable_set elim;
  factor F;
  factor local_80;
  
  factor::factor(&F,&this->second->theta);
  uVar5 = 0;
  while( true ) {
    pnVar1 = this->second;
    ppeVar2 = (pnVar1->edges).
              super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pnVar1->edges).
                      super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppeVar2 >> 3) <= uVar5)
    break;
    peVar3 = ppeVar2[uVar5];
    if (peVar3 != this) {
      lVar4 = 0xa8;
      if ((peVar3->first->id == pnVar1->id) || (lVar4 = 0x48, peVar3->second->id == pnVar1->id)) {
        factor::binaryOpIP<merlin::factor::binOpTimes>
                  (&F,(long)&(peVar3->sepset).m_v.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar4);
      }
    }
    uVar5 = uVar5 + 1;
  }
  variable_set::operator-(&elim,&pnVar1->clique,&this->sepset);
  if (elim.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      elim.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    factor::sum(&local_80,&F,&elim);
    factor::operator=(&F,&local_80);
    factor::~factor(&local_80);
  }
  factor::operator=(&this->bwd,&F);
  variable_set::~variable_set(&elim);
  factor::~factor(&F);
  return;
}

Assistant:

void detail::edge::messageBwd() {

	// collect the original functions
	factor F = second->theta;

	// collect the incoming messages
	for (size_t i = 0; i < second->edges.size(); ++i) {
		detail::edge* e = second->edges[i];
		if (e == this) {
			continue; // skip current edge
		}
		if (e->first->id == second->id) {
			F *= e->bwd; //e->getMessage2();
		} else if (e->second->id == second->id) {
			F *= e->fwd; //e->getMessage1();
		}
	}

	// marginalize the eliminator
	variable_set elim = (second->clique - sepset);
	if (elim.size() > 0) {
		F = F.sum(elim);
	}

	this->bwd = F;
}